

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetwork *nn)

{
  Rep *pRVar1;
  long lVar2;
  bool bVar3;
  __type _Var4;
  Type *pTVar5;
  Type *b;
  Type *pTVar6;
  long lVar7;
  undefined8 *puVar8;
  NetworkUpdateParameters *pNVar9;
  RepeatedPtrField<CoreML::Specification::LossLayer> *this;
  byte bVar10;
  void **ppvVar11;
  ulong uVar12;
  int index;
  FeatureType *b_00;
  char *pcVar13;
  FeatureType *pFVar14;
  byte bVar15;
  int j;
  int iVar16;
  long lVar17;
  string err;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string target;
  string trainingInputTarget;
  string targetTypeString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string typeString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  iVar16 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar16 < 2) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
    goto LAB_00220b50;
  }
  trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index = 0;
  while( true ) {
    target._M_dataplus._M_p._0_4_ = index;
    if (iVar16 <= index) break;
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,index);
    iVar16 = 0;
    do {
      if ((modelDescription->input_).super_RepeatedPtrFieldBase.current_size_ <= iVar16) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&trainingInputExclusiveIndices,(value_type_conflict4 *)&target);
        break;
      }
      b = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                    (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar16);
      bVar3 = CoreML::Specification::isEquivalent(pTVar5,b);
      iVar16 = iVar16 + 1;
    } while (!bVar3);
    index = (int)target._M_dataplus._M_p + 1;
    iVar16 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  }
  if ((long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
  else if ((long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start >> 2 == (long)iVar16) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
  else {
    target._M_dataplus._M_p = (pointer)&target.field_2;
    target._M_string_length = 0;
    target.field_2._M_local_buf[0] = '\0';
    pNVar9 = nn->updateparams_;
    if (pNVar9 == (NetworkUpdateParameters *)0x0) {
      pNVar9 = (NetworkUpdateParameters *)
               &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    this = &pNVar9->losslayers_;
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,0);
    if (pTVar6->_oneof_case_[0] == 10) {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,0);
      CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(pTVar6);
LAB_002207b9:
      std::__cxx11::string::_M_assign((string *)&target);
    }
    else {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,0);
      if (pTVar6->_oneof_case_[0] == 0xb) {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,0);
        CoreML::Specification::LossLayer::meansquarederrorlosslayer(pTVar6);
        goto LAB_002207b9;
      }
    }
    lVar7 = __dynamic_cast(nn,&CoreML::Specification::NeuralNetwork::typeinfo,
                           &CoreML::Specification::NeuralNetworkClassifier::typeinfo,
                           0xfffffffffffffffe);
    bVar15 = 0;
    uVar12 = 0;
    do {
      if ((ulong)((long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar12) {
        if (bVar15 == 0) {
          if (lVar7 == 0) {
            std::operator+(&trainingInputTarget,
                           "The training inputs don\'t include the loss layer\'s target: ",&target);
          }
          else {
            std::operator+(&trainingInputTarget,
                           "The training inputs don\'t include the target of the classifier: ",
                           (modelDescription->predictedfeaturename_).ptr_);
          }
          std::__cxx11::string::operator=((string *)&err,(string *)&trainingInputTarget);
          std::__cxx11::string::~string((string *)&trainingInputTarget);
          CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        }
        else {
          CoreML::Result::Result(__return_storage_ptr__);
        }
        break;
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,
                          trainingInputExclusiveIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12]);
      std::__cxx11::string::string((string *)&trainingInputTarget,(string *)(pTVar5->name_).ptr_);
      bVar10 = bVar15;
      if ((lVar7 == 0) ||
         (_Var4 = std::operator==(&trainingInputTarget,
                                  (modelDescription->predictedfeaturename_).ptr_), !_Var4)) {
LAB_00220a7e:
        _Var4 = std::operator==(&target,&trainingInputTarget);
        bVar15 = _Var4 | bVar10;
        bVar3 = true;
      }
      else {
        pRVar1 = (modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar11 = pRVar1->elements;
        if (pRVar1 == (Rep *)0x0) {
          ppvVar11 = (void **)0x0;
        }
        iVar16 = (modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
        lVar17 = 0;
        do {
          if ((long)iVar16 * 8 == lVar17) goto LAB_00220a7e;
          lVar2 = *(long *)((long)ppvVar11 + lVar17);
          _Var4 = std::operator==(&trainingInputTarget,
                                  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(lVar2 + 0x10));
          lVar17 = lVar17 + 8;
        } while (!_Var4);
        pFVar14 = pTVar5->type_;
        if (pFVar14 == (FeatureType *)0x0) {
          pFVar14 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
        }
        b_00 = *(FeatureType **)(lVar2 + 0x20);
        if (b_00 == (FeatureType *)0x0) {
          b_00 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
        }
        bVar3 = CoreML::Specification::operator==(pFVar14,b_00);
        bVar10 = 1;
        if (bVar3) goto LAB_00220a7e;
        puVar8 = *(undefined8 **)(lVar2 + 0x20);
        if (puVar8 == (undefined8 *)0x0) {
          puVar8 = &CoreML::Specification::_FeatureType_default_instance_;
        }
        pcVar13 = "String";
        if (*(int *)((long)puVar8 + 0x24) == 1) {
          pcVar13 = "Int64";
        }
        std::__cxx11::string::string((string *)&typeString,pcVar13,(allocator *)&targetTypeString);
        pFVar14 = pTVar5->type_;
        if (pFVar14 == (FeatureType *)0x0) {
          pFVar14 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
        }
        pcVar13 = "String";
        if (pFVar14->_oneof_case_[0] == 1) {
          pcVar13 = "Int64";
        }
        std::__cxx11::string::string((string *)&targetTypeString,pcVar13,(allocator *)&local_50);
        std::operator+(&local_f8,"The type of the training input provided: ",&trainingInputTarget);
        std::operator+(&local_d8,&local_f8,
                       " doesn\'t match the expected type of the classifier. Found: ");
        std::operator+(&local_b8,&local_d8,&targetTypeString);
        std::operator+(&local_138,&local_b8,", expected: ");
        std::operator+(&local_98,&local_138,&typeString);
        std::operator+(&local_50,&local_98,".");
        std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        std::__cxx11::string::~string((string *)&targetTypeString);
        std::__cxx11::string::~string((string *)&typeString);
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&trainingInputTarget);
      uVar12 = uVar12 + 1;
    } while (bVar3);
    std::__cxx11::string::~string((string *)&target);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>);
LAB_00220b50:
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}